

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

object * find(void)

{
  bool bVar1;
  object *local_28;
  object *obj;
  object *x;
  object *s;
  int ret;
  int cond;
  
  local_28 = (object *)0x0;
  bVar1 = true;
  x = topScope;
  stringCopy(idName,guard->name);
  while( true ) {
    if (!bVar1) {
      return local_28;
    }
    obj = x->next;
    s._0_4_ = stringCompare(obj->name,idName);
    while ((int)s != 0) {
      obj = obj->next;
      s._0_4_ = stringCompare(obj->name,idName);
    }
    if (obj != guard) {
      local_28 = obj;
      bVar1 = false;
    }
    if ((x == universe) && (bVar1)) break;
    x = x->dsc;
  }
  mark("undef");
  exit(-1);
}

Assistant:

object * find (void) {
	variable bool cond;
	variable int ret;
	variable struct object *s; variable struct object *x; variable struct object *obj;
	s = NULL; x = NULL;	obj = NULL; ret = -1; cond = true;
	s = topScope;

	/* copy idname to guard */
	stringCopy(idName,guard->name); 
	while (cond == true){ 
		x = s->next; 
		ret = stringCompare(x->name,idName);	
		while (ret != 0) { /* iterate over objects in currentLevel, while names are different */
			x = x->next; 
			ret = stringCompare(x->name,idName);
		}

		/* did we find the guard */
		if (x != guard) { 
			obj = x;
			cond = false;
		}
		
		/* if we reach the universe and nothing was found --> error */
		if ((s == universe) && (cond == true)) { 
			obj = x;
			mark("undef");
			exit(-1);
		}
		s = s->dsc; /* step up one level */
	}
	return obj;
}